

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luma_exception.h
# Opt level: O2

void __thiscall LumaException::LumaException(LumaException *this,char *message)

{
  allocator<char> local_39;
  string local_38 [32];
  
  *(undefined ***)this = &PTR__LumaException_001de4b0;
  (this->msg)._M_dataplus._M_p = (pointer)&(this->msg).field_2;
  (this->msg)._M_string_length = 0;
  (this->msg).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string<std::allocator<char>>(local_38,message,&local_39);
  std::__cxx11::string::operator=((string *)&this->msg,local_38);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

LumaException( const char *message )
  {
    msg = std::string( message );
  }